

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_start_map(mpack_writer_t *writer,uint32_t count)

{
  _Bool _Var1;
  size_t sVar2;
  uint32_t count_local;
  mpack_writer_t *writer_local;
  
  mpack_writer_track_element(writer);
  if (count < 0x10) {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((sVar2 != 0) || (_Var1 = mpack_writer_ensure(writer,1), _Var1)) {
      mpack_encode_fixmap(writer->current,(uint8_t)count);
      writer->current = writer->current + 1;
    }
  }
  else if (count < 0x10000) {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((2 < sVar2) || (_Var1 = mpack_writer_ensure(writer,3), _Var1)) {
      mpack_encode_map16(writer->current,(uint16_t)count);
      writer->current = writer->current + 3;
    }
  }
  else {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((4 < sVar2) || (_Var1 = mpack_writer_ensure(writer,5), _Var1)) {
      mpack_encode_map32(writer->current,count);
      writer->current = writer->current + 5;
    }
  }
  mpack_writer_track_push(writer,mpack_type_map,(ulong)count);
  return;
}

Assistant:

void mpack_start_map(mpack_writer_t* writer, uint32_t count) {
    mpack_writer_track_element(writer);

    if (count <= 15) {
        MPACK_WRITE_ENCODED(mpack_encode_fixmap, MPACK_TAG_SIZE_FIXMAP, (uint8_t)count);
    } else if (count <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_map16, MPACK_TAG_SIZE_MAP16, (uint16_t)count);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_map32, MPACK_TAG_SIZE_MAP32, (uint32_t)count);
    }

    mpack_writer_track_push(writer, mpack_type_map, count);
}